

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::addCompoundValue(Builder *this,uint8_t type)

{
  Builder *this_00;
  ValueLength in_RDI;
  undefined7 in_stack_ffffffffffffffc8;
  uint8_t in_stack_ffffffffffffffcf;
  Builder *in_stack_ffffffffffffffe0;
  
  reserve(in_stack_ffffffffffffffe0,in_RDI);
  this_00 = (Builder *)(in_RDI + 0x70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x90));
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::push_back((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
               *)this_00,(value_type *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)
             );
  appendByteUnchecked(this_00,in_stack_ffffffffffffffcf);
  memset((void *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20)),0,8);
  advance(this_00,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void addCompoundValue(uint8_t type) {
    reserve(9);
    // an Array or Object is started:
    _stack.push_back(CompoundInfo{_pos, _indexes.size()});
    appendByteUnchecked(type);
    std::memset(_start + _pos, 0, 8);
    advance(8);  // Will be filled later with bytelength and nr subs
  }